

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O0

void __thiscall
rpn::CommandCallExpression::CallCommand
          (CommandCallExpression *this,results_iterator argsBegin,results_iterator argsEnd,
          CommandContext *commandContext)

{
  anon_class_16_2_7294f495 __f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  allocator<char> local_89;
  undefined1 local_88 [8];
  string result;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string delimiter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  CommandContext *commandContext_local;
  CommandCallExpression *this_local;
  results_iterator argsEnd_local;
  results_iterator argsBegin_local;
  
  argsEnd_local = argsBegin;
  delimiter.field_2._8_8_ =
       __gnu_cxx::
       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator*(&argsEnd_local);
  std::
  advance<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,int>
            (&argsEnd_local,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,", ",&local_51);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,"[call(",&local_89);
  std::allocator<char>::~allocator(&local_89);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 delimiter.field_2._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::__cxx11::string::operator+=((string *)local_88,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  __f.delimiter = (string *)local_50;
  __f.result = (string *)local_88;
  std::
  for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,rpn::CommandCallExpression::CallCommand(__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,rpn::CommandContext&)const::_lambda(auto:1_const&)_1_>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )argsEnd_local._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )argsEnd._M_current,__f);
  std::__cxx11::string::size();
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)local_88);
  std::__cxx11::string::operator+=((string *)local_88,")]");
  std::__cxx11::string::operator=((string *)commandContext,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void CallCommand(
        results_iterator argsBegin,
        results_iterator argsEnd,
        CommandContext& commandContext) const
    {
        const auto& name = *argsBegin;
        std::advance(argsBegin, 1);

        const std::string delimiter{", "};
        std::string result{"[call("};
        result += name + delimiter;

        std::for_each(
            argsBegin, argsEnd, [&result, &delimiter](const auto& arg) {
                result += arg + delimiter;
            });
        result.resize(result.size() - delimiter.size());
        result += ")]";

        commandContext.result = std::move(result);
    }